

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

int Ivy_FastMapNodeFaninCompact2(Ivy_Man_t *pAig,Ivy_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront)

{
  int iVar1;
  Ivy_Obj_t *pObj_00;
  int local_3c;
  int i;
  Ivy_Obj_t *pFanin;
  Vec_Ptr_t *vFront_local;
  int nLimit_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *pAig_local;
  
  local_3c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vFront);
    if (iVar1 <= local_3c) {
      return 0;
    }
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(vFront,local_3c);
    iVar1 = Ivy_ObjIsCi(pObj_00);
    if ((iVar1 == 0) && (iVar1 = Ivy_FastMapNodeFaninCost(pAig,pObj_00), iVar1 < 1)) break;
    local_3c = local_3c + 1;
  }
  Ivy_FastMapNodeFaninUpdate(pAig,pObj_00,vFront);
  return 1;
}

Assistant:

int Ivy_FastMapNodeFaninCompact2( Ivy_Man_t * pAig, Ivy_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront )
{
    Ivy_Obj_t * pFanin;
    int i;
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pFanin, i )
    {
        if ( Ivy_ObjIsCi(pFanin) )
            continue;
        if ( Ivy_FastMapNodeFaninCost(pAig, pFanin) <= 0 )
        {
            Ivy_FastMapNodeFaninUpdate( pAig, pFanin, vFront );
            return 1;
        }
    }
    return 0;
}